

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O0

void __thiscall
FIX43::NewOrderSingle::NewOrderSingle
          (NewOrderSingle *this,ClOrdID *aClOrdID,HandlInst *aHandlInst,Side *aSide,
          TransactTime *aTransactTime,OrdType *aOrdType)

{
  MsgType local_90;
  OrdType *local_38;
  OrdType *aOrdType_local;
  TransactTime *aTransactTime_local;
  Side *aSide_local;
  HandlInst *aHandlInst_local;
  ClOrdID *aClOrdID_local;
  NewOrderSingle *this_local;
  
  local_38 = aOrdType;
  aOrdType_local = (OrdType *)aTransactTime;
  aTransactTime_local = (TransactTime *)aSide;
  aSide_local = (Side *)aHandlInst;
  aHandlInst_local = (HandlInst *)aClOrdID;
  aClOrdID_local = (ClOrdID *)this;
  MsgType();
  FIX43::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__NewOrderSingle_0018a0a8;
  set(this,(ClOrdID *)aHandlInst_local);
  set(this,(HandlInst *)aSide_local);
  set(this,(Side *)aTransactTime_local);
  set(this,(TransactTime *)aOrdType_local);
  set(this,local_38);
  return;
}

Assistant:

NewOrderSingle(
      const FIX::ClOrdID& aClOrdID,
      const FIX::HandlInst& aHandlInst,
      const FIX::Side& aSide,
      const FIX::TransactTime& aTransactTime,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aClOrdID);
      set(aHandlInst);
      set(aSide);
      set(aTransactTime);
      set(aOrdType);
    }